

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O1

void __thiscall setup::version::load(version *this,istream *is)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  input_iterator_type OuterIt;
  long lVar8;
  long *plVar9;
  long *plVar10;
  _WordT _Var11;
  ulong uVar12;
  ulong uVar13;
  long *plVar14;
  ulong uVar15;
  bool bVar16;
  stored_legacy_version legacy_version;
  string version_str;
  stored_version version_string;
  char local_b4;
  undefined1 uStack_b3;
  char cStack_b2;
  undefined1 uStack_b1;
  char cStack_b0;
  undefined2 uStack_af;
  char cStack_ad;
  undefined4 local_ac;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  uint local_84;
  version *local_80;
  long *local_78;
  undefined8 local_70;
  undefined8 local_68;
  int local_60;
  undefined1 local_5c;
  undefined1 local_38 [8];
  
  std::istream::read((char *)is,(long)&local_b4);
  if ((local_b4 == 'i') && (local_ac._3_1_ == '\x1a')) {
    lVar8 = 0;
    do {
      if (*(int *)((long)&DAT_00175138 + lVar8) == local_ac &&
          *(long *)((long)&(anonymous_namespace)::legacy_versions + lVar8) ==
          CONCAT17(cStack_ad,
                   CONCAT25(uStack_af,
                            CONCAT14(cStack_b0,
                                     CONCAT13(uStack_b1,CONCAT12(cStack_b2,CONCAT11(uStack_b3,0x69))
                                             ))))) {
        this->value = *(version_constant *)(&DAT_00175140 + lVar8);
        _Var11 = *(_WordT *)(&DAT_00175148 + lVar8);
LAB_00143a91:
        (this->variant)._flags.super__Base_bitset<1UL>._M_w = _Var11;
        this->known = true;
        return;
      }
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    if ((((cStack_b2 != '.') || (cStack_b0 != '.')) || (cStack_ad != '-')) ||
       ((char)local_ac != '-')) {
LAB_00143e6c:
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = &PTR__exception_00171358;
      __cxa_throw(puVar7,&version_error::typeinfo,std::exception::~exception);
    }
    _Var11 = 1;
    if (local_ac._2_1_ != '6' || local_ac._1_1_ != '1') {
      if ((local_ac._1_1_ != '3') || (local_ac._2_1_ != '2')) goto LAB_00143e6c;
      _Var11 = 0;
    }
    (this->variant)._flags.super__Base_bitset<1UL>._M_w = _Var11;
    local_68 = CONCAT17(0x2d,CONCAT25(uStack_af,
                                      CONCAT14(0x2e,CONCAT13(uStack_b1,
                                                             CONCAT12(0x2e,CONCAT11(uStack_b3,0x69))
                                                            ))));
    local_60 = local_ac;
    local_70 = 0xc;
    local_5c = 0;
    local_78 = &local_68;
    uVar1 = util::to_unsigned((char *)((long)&local_68 + 1),1);
    uVar2 = util::to_unsigned((char *)((long)local_78 + 3),1);
    uVar3 = util::to_unsigned((char *)((long)local_78 + 5),2);
    this->value = uVar3 << 8 | uVar2 << 0x10 | uVar1 << 0x18;
    this->known = false;
    local_98[0] = local_68;
    plVar14 = local_78;
    if (local_78 == &local_68) {
      return;
    }
    goto LAB_00143e52;
  }
  local_70 = CONCAT44(local_70._4_4_,local_ac);
  local_78 = (long *)CONCAT17(cStack_ad,
                              CONCAT25(uStack_af,
                                       CONCAT14(cStack_b0,
                                                CONCAT13(uStack_b1,
                                                         CONCAT12(cStack_b2,
                                                                  CONCAT11(uStack_b3,local_b4))))));
  std::istream::read((char *)is,(long)&local_70 + 4);
  lVar8 = 0;
  do {
    if (((&(anonymous_namespace)::versions)[lVar8] != '\0') &&
       (iVar4 = bcmp(&local_78,&(anonymous_namespace)::versions + lVar8,0x40), iVar4 == 0)) {
      this->value = *(version_constant *)((long)&DAT_001751b0 + lVar8);
      _Var11 = *(_WordT *)((long)&DAT_001751b8 + lVar8);
      goto LAB_00143a91;
    }
    lVar8 = lVar8 + 0x50;
  } while (lVar8 != 0x23a0);
  local_a8 = (long *)((ulong)local_a8 & 0xffffffffffffff00);
  pcVar5 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(&local_78,local_38);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,&local_78,pcVar5);
  plVar14 = (long *)((long)local_a8 + local_a0);
  plVar6 = plVar14;
  plVar9 = local_a8;
  plVar10 = plVar14;
  uVar12 = local_a0;
  if (local_a0 != 0) {
    do {
      uVar13 = 0;
      do {
        uVar15 = uVar13;
        if ((*(char *)((long)plVar9 + uVar13) != "Inno Setup"[uVar13]) ||
           (uVar15 = uVar13 + 1, uVar12 - 1 == uVar13)) break;
        bVar16 = uVar13 != 9;
        uVar13 = uVar15;
      } while (bVar16);
      plVar6 = (long *)((long)plVar9 + uVar15);
      plVar10 = plVar9;
    } while ((uVar15 != 10) &&
            (plVar9 = (long *)((long)plVar9 + 1), plVar6 = plVar14, plVar10 = plVar14,
            uVar12 = uVar12 - 1, plVar9 != plVar14));
  }
  if (plVar10 == plVar6) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00171358;
    __cxa_throw(puVar7,&version_error::typeinfo,std::exception::~exception);
  }
  this->value = 0;
  local_80 = this;
  lVar8 = std::__cxx11::string::find((char)&local_a8,0x28);
  if (lVar8 != -1) {
    do {
      if (5 < local_a0 - lVar8) {
        uVar12 = lVar8 + 1;
        lVar8 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x15a624,uVar12);
        if ((lVar8 != -1) && (*(char *)((long)local_a8 + lVar8) == '.')) {
          local_84 = util::to_unsigned((char *)((long)local_a8 + uVar12),lVar8 - uVar12);
          uVar12 = lVar8 + 1;
          lVar8 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x15a624,uVar12);
          if ((lVar8 != -1) && (*(char *)((long)local_a8 + lVar8) == '.')) {
            uVar1 = util::to_unsigned((char *)((long)local_a8 + uVar12),lVar8 - uVar12);
            uVar13 = lVar8 + 1;
            uVar12 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x15a624,uVar13);
            if ((uVar12 != 0xffffffffffffffff) &&
               ((uVar2 = util::to_unsigned((char *)(uVar13 + (long)local_a8),uVar12 - uVar13),
                *(char *)((long)local_a8 + uVar12) != 'a' ||
                (uVar12 = uVar12 + 1, uVar12 < local_a0)))) {
              uVar3 = 0;
              if (*(char *)((long)local_a8 + uVar12) == '.') {
                uVar12 = uVar12 + 1;
                lVar8 = std::__cxx11::string::find_first_not_of((char *)&local_a8,0x15a624,uVar12);
                uVar3 = 0;
                if (lVar8 - uVar12 != 0 && lVar8 != -1) {
                  uVar3 = util::to_unsigned((char *)(uVar12 + (long)local_a8),lVar8 - uVar12);
                }
              }
              uVar1 = uVar2 << 8 | uVar1 << 0x10 | local_84 << 0x18 | uVar3;
              if (uVar1 < local_80->value) {
                uVar1 = local_80->value;
              }
              local_80->value = uVar1;
            }
          }
        }
      }
      lVar8 = std::__cxx11::string::find((char)&local_a8,0x28);
    } while (lVar8 != -1);
  }
  uVar1 = local_80->value;
  if (uVar1 == 0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00171358;
    __cxa_throw(puVar7,&version_error::typeinfo,std::exception::~exception);
  }
  (local_80->variant)._flags.super__Base_bitset<1UL>._M_w = 0;
  if (uVar1 < 0x6030000) {
    plVar14 = (long *)((long)local_a8 + local_a0);
    plVar6 = plVar14;
    plVar9 = local_a8;
    plVar10 = plVar14;
    uVar12 = local_a0;
    if (local_a0 != 0) {
      do {
        uVar13 = 0;
        do {
          uVar15 = uVar13;
          if ((*(char *)((long)plVar9 + uVar13) != "(u)"[uVar13]) ||
             (uVar15 = uVar13 + 1, uVar12 - 1 == uVar13)) break;
          bVar16 = uVar13 != 2;
          uVar13 = uVar15;
        } while (bVar16);
        plVar6 = plVar9;
        plVar10 = (long *)((long)plVar9 + uVar15);
      } while ((uVar15 != 3) &&
              (plVar9 = (long *)((long)plVar9 + 1), plVar6 = plVar14, plVar10 = plVar14,
              uVar12 = uVar12 - 1, plVar9 != plVar14));
    }
    if (plVar6 != plVar10) goto LAB_00143d6d;
    plVar6 = plVar14;
    plVar9 = local_a8;
    plVar10 = plVar14;
    uVar12 = local_a0;
    if (local_a0 != 0) {
      do {
        uVar13 = 0;
        do {
          uVar15 = uVar13;
          if ((*(char *)((long)plVar9 + uVar13) != "(U)"[uVar13]) ||
             (uVar15 = uVar13 + 1, uVar12 - 1 == uVar13)) break;
          bVar16 = uVar13 != 2;
          uVar13 = uVar15;
        } while (bVar16);
        plVar6 = (long *)((long)plVar9 + uVar15);
        plVar10 = plVar9;
      } while ((uVar15 != 3) &&
              (plVar9 = (long *)((long)plVar9 + 1), plVar6 = plVar14, plVar10 = plVar14,
              uVar12 = uVar12 - 1, plVar9 != plVar14));
    }
    if (plVar10 != plVar6) goto LAB_00143d6d;
  }
  else {
LAB_00143d6d:
    (local_80->variant)._flags.super__Base_bitset<1UL>._M_w = 2;
  }
  plVar14 = (long *)((long)local_a8 + local_a0);
  plVar6 = plVar14;
  plVar9 = local_a8;
  plVar10 = plVar14;
  uVar12 = local_a0;
  if (local_a0 != 0) {
    do {
      uVar13 = 0;
      do {
        uVar15 = uVar13;
        if ((*(char *)((long)plVar9 + uVar13) != "My Inno Setup Extensions"[uVar13]) ||
           (uVar15 = uVar13 + 1, uVar12 - 1 == uVar13)) break;
        bVar16 = uVar13 != 0x17;
        uVar13 = uVar15;
      } while (bVar16);
      plVar6 = plVar9;
      plVar10 = (long *)((long)plVar9 + uVar15);
    } while ((uVar15 != 0x18) &&
            (plVar9 = (long *)((long)plVar9 + 1), plVar6 = plVar14, plVar10 = plVar14,
            uVar12 = uVar12 - 1, plVar9 != plVar14));
  }
  if (plVar6 == plVar10) {
    plVar6 = plVar14;
    plVar9 = local_a8;
    plVar10 = plVar14;
    if (local_a0 != 0) {
      do {
        local_a0 = local_a0 - 1;
        uVar12 = 0;
        do {
          uVar13 = uVar12;
          if ((*(char *)((long)plVar9 + uVar12) != "with ISX"[uVar12]) ||
             (uVar13 = uVar12 + 1, local_a0 == uVar12)) break;
          bVar16 = uVar12 != 7;
          uVar12 = uVar13;
        } while (bVar16);
        plVar6 = (long *)((long)plVar9 + uVar13);
        plVar10 = plVar9;
      } while ((uVar13 != 8) &&
              (plVar9 = (long *)((long)plVar9 + 1), plVar6 = plVar14, plVar10 = plVar14,
              plVar9 != plVar14));
    }
    if (plVar10 != plVar6) goto LAB_00143e40;
  }
  else {
LAB_00143e40:
    *(byte *)&(local_80->variant)._flags.super__Base_bitset<1UL>._M_w =
         (byte)(local_80->variant)._flags.super__Base_bitset<1UL>._M_w | 4;
  }
  local_80->known = false;
  plVar14 = local_a8;
  if (local_a8 == local_98) {
    return;
  }
LAB_00143e52:
  operator_delete(plVar14,local_98[0] + 1);
  return;
}

Assistant:

void version::load(std::istream & is) {
	
	static const char digits[] = "0123456789";
	
	BOOST_STATIC_ASSERT(sizeof(stored_legacy_version) <= sizeof(stored_version));
	
	stored_legacy_version legacy_version;
	is.read(legacy_version, std::streamsize(sizeof(legacy_version)));
	
	if(legacy_version[0] == 'i' && legacy_version[sizeof(legacy_version) - 1] == '\x1a') {
		
		for(size_t i = 0; i < size_t(boost::size(legacy_versions)); i++) {
			if(!memcmp(legacy_version, legacy_versions[i].name, sizeof(legacy_version))) {
				value = legacy_versions[i].version;
				variant = legacy_versions[i].variant;
				known = true;
				debug("known legacy version: \"" << versions[i].name << '"');
				return;
			}
		}
		
		debug("unknown legacy version: \""
		      << std::string(legacy_version, sizeof(legacy_version)) << '"');
		
		if(legacy_version[0] != 'i' || legacy_version[2] != '.' || legacy_version[4] != '.'
		   || legacy_version[7] != '-' || legacy_version[8] != '-') {
			throw version_error();
		}
		
		if(legacy_version[9] == '1' && legacy_version[10] == '6') {
			variant = Bits16;
		} else if(legacy_version[9] == '3' && legacy_version[10] == '2') {
			variant = 0;
		} else {
			throw version_error();
		}
		
		std::string version_str(legacy_version, sizeof(legacy_version));
		
		try {
			unsigned a = util::to_unsigned(version_str.data() + 1, 1);
			unsigned b = util::to_unsigned(version_str.data() + 3, 1);
			unsigned c = util::to_unsigned(version_str.data() + 5, 2);
			value = INNO_VERSION(a, b, c);
		} catch(const boost::bad_lexical_cast &) {
			throw version_error();
		}
		
		known = false;
		
		return;
	}
	
	stored_version version_string;
	BOOST_STATIC_ASSERT(sizeof(legacy_version) <= sizeof(version_string));
	memcpy(version_string, legacy_version, sizeof(legacy_version));
	is.read(version_string + sizeof(legacy_version),
	        std::streamsize(sizeof(version_string) - sizeof(legacy_version)));
	
	
	for(size_t i = 0; i < size_t(boost::size(versions)); i++) {
		if(versions[i].name[0] != '\0' && !memcmp(version_string, versions[i].name, sizeof(version_string))) {
			value = versions[i].version;
			variant = versions[i].variant;
			known = true;
			debug("known version: \"" << versions[i].name << '"');
			return;
		}
	}
	
	char * end = std::find(version_string, version_string + boost::size(version_string), '\0');
	std::string version_str(version_string, end);
	debug("unknown version: \"" << version_str << '"');
	if(!boost::contains(version_str, "Inno Setup")) {
		throw version_error();
	}
	
	value = 0;
	size_t bracket = version_str.find('(');
	for(; bracket != std::string::npos; bracket = version_str.find('(', bracket + 1)) {
		
		if(version_str.length() - bracket < 6) {
			continue;
		}
		
		try {
			
			size_t a_start = bracket + 1;
			size_t a_end = version_str.find_first_not_of(digits, a_start);
			if(a_end == std::string::npos || version_str[a_end] != '.') {
				continue;
			}
			unsigned a = util::to_unsigned(version_str.data() + a_start, a_end - a_start);
			
			size_t b_start = a_end + 1;
			size_t b_end = version_str.find_first_not_of(digits, b_start);
			if(b_end == std::string::npos || version_str[b_end] != '.') {
				continue;
			}
			unsigned b = util::to_unsigned(version_str.data() + b_start, b_end - b_start);
			
			size_t c_start = b_end + 1;
			size_t c_end = version_str.find_first_not_of(digits, c_start);
			if(c_end == std::string::npos) {
				continue;
			}
			unsigned c = util::to_unsigned(version_str.data() + c_start, c_end - c_start);
			
			size_t d_start = c_end;
			if(version_str[d_start] == 'a') {
				if(d_start + 1 >= version_str.length()) {
					continue;
				}
				d_start++;
			}
			
			unsigned d = 0;
			if(version_str[d_start] == '.') {
				d_start++;
				size_t d_end = version_str.find_first_not_of(digits, d_start);
				if(d_end != std::string::npos && d_end != d_start) {
					d = util::to_unsigned(version_str.data() + d_start, d_end - d_start);
				}
			}
			
			value = std::max(value, INNO_VERSION_EXT(a, b, c, d));
			
		} catch(const boost::bad_lexical_cast &) {
			continue;
		}
	}
	if(!value) {
		throw version_error();
	}
	
	variant = 0;
	if(value >= INNO_VERSION(6, 3, 0) ||
	   boost::contains(version_str, "(u)") || boost::contains(version_str, "(U)")) {
		variant |= Unicode;
	}
	if(boost::contains(version_str, "My Inno Setup Extensions") || boost::contains(version_str, "with ISX")) {
		variant |= ISX;
	}
	
	known = false;
}